

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O1

int raviV_initjit(lua_State *L)

{
  global_State *pgVar1;
  long *plVar2;
  int iVar3;
  int extraout_EAX;
  ravi_State *prVar4;
  MIR_context_t pMVar5;
  long lVar6;
  double dVar7;
  
  pgVar1 = L->l_G;
  iVar3 = -1;
  if (pgVar1->ravi_state == (ravi_State *)0x0) {
    lVar6 = 1;
    prVar4 = (ravi_State *)calloc(1,0x88);
    prVar4->min_code_size_ = 0x96;
    prVar4->min_exec_count_ = 0x32;
    *(ushort *)&prVar4->field_0x10 = (ushort)*(undefined4 *)&prVar4->field_0x10 & 0xff17 | 0x50;
    dVar7 = (double)_MIR_get_api_version();
    if ((dVar7 != 0.2) || (NAN(dVar7))) {
      raviV_initjit_cold_1();
      lVar6 = *(long *)(lVar6 + 0x18);
      plVar2 = *(long **)(lVar6 + 0x568);
      if (plVar2 != (long *)0x0) {
        if (*plVar2 != 0) {
          MIR_finish();
        }
        free(*(void **)(lVar6 + 0x568));
        return extraout_EAX;
      }
      return 0;
    }
    pMVar5 = (MIR_context_t)_MIR_init();
    prVar4->jit = pMVar5;
    pgVar1->ravi_state = prVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int raviV_initjit(struct lua_State *L) {
  global_State *G = G(L);
  if (G->ravi_state != NULL)
    return -1;
  ravi_State *jit = (ravi_State *)calloc(1, sizeof(ravi_State));
  jit->auto_ = 0;
  jit->enabled_ = 1;
  jit->min_code_size_ = 150;
  jit->min_exec_count_ = 50;
  jit->opt_level_ = 2;
  // The parameter true means we will be dumping stuff as we compile
  jit->jit = MIR_init();
  G->ravi_state = jit;
  return 0;
}